

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O1

void Ivy_TableInsert(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  timespec ts;
  timespec tStack_38;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                  ,0x6c,"void Ivy_TableInsert(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (0xfffffffc < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
    if (((pObj->Id & 0x3f) == 0) && (p->nTableSize < (p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) * 2))
    {
      clock_gettime(3,&tStack_38);
      piVar4 = p->pTable;
      uVar1 = p->nTableSize;
      uVar5 = (p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) * 5 - 1;
      while( true ) {
        do {
          uVar6 = uVar5 + 1;
          uVar2 = uVar5 & 1;
          uVar5 = uVar6;
        } while (uVar2 != 0);
        if (uVar6 < 9) break;
        iVar7 = 5;
        while (uVar6 % (iVar7 - 2U) != 0) {
          uVar2 = iVar7 * iVar7;
          iVar7 = iVar7 + 2;
          if (uVar6 < uVar2) goto LAB_007e0261;
        }
      }
LAB_007e0261:
      p->nTableSize = uVar6;
      piVar3 = (int *)malloc((long)(int)uVar6 << 2);
      p->pTable = piVar3;
      memset(piVar3,0,(long)(int)uVar6 << 2);
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          uVar5 = piVar4[uVar8];
          if ((ulong)uVar5 != 0) {
            if (((int)uVar5 < 0) || (p->vObjs->nSize <= (int)uVar5)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            piVar3 = Ivy_TableFind(p,(Ivy_Obj_t *)p->vObjs->pArray[uVar5]);
            if (*piVar3 != 0) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                            ,0xe4,"void Ivy_TableResize(Ivy_Man_t *)");
            }
            *piVar3 = piVar4[uVar8];
          }
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      if (piVar4 != (int *)0x0) {
        free(piVar4);
      }
    }
    piVar4 = Ivy_TableFind(p,pObj);
    if (*piVar4 != 0) {
      __assert_fail("*pPlace == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                    ,0x75,"void Ivy_TableInsert(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    *piVar4 = pObj->Id;
  }
  return;
}

Assistant:

void Ivy_TableInsert( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int * pPlace;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return;
    if ( (pObj->Id & 63) == 0 )
    {
        if ( p->nTableSize < 2 * Ivy_ManHashObjNum(p) )
            Ivy_TableResize( p );
    }
    pPlace = Ivy_TableFind( p, pObj );
    assert( *pPlace == 0 );
    *pPlace = pObj->Id;
}